

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpbitdht.cc
# Opt level: O0

int __thiscall UdpBitDht::recvPkt(UdpBitDht *this,void *data,int size,sockaddr_in *from)

{
  int iVar1;
  bdStackMutex local_38;
  bdStackMutex stack;
  sockaddr_in *from_local;
  int size_local;
  void *data_local;
  UdpBitDht *this_local;
  
  stack.mMtx = (bdMutex *)from;
  bdStackMutex::bdStackMutex(&local_38,&this->dhtMtx);
  iVar1 = bdNodeManager::isBitDhtPacket
                    (this->mBitDhtManager,(char *)data,size,(sockaddr_in *)stack.mMtx);
  if (iVar1 != 0) {
    this->mReadBytes = this->mReadBytes + size;
    bdNode::incomingMsg(&this->mBitDhtManager->super_bdNode,(sockaddr_in *)stack.mMtx,(char *)data,
                        size);
  }
  this_local._4_4_ = (uint)(iVar1 != 0);
  bdStackMutex::~bdStackMutex(&local_38);
  return this_local._4_4_;
}

Assistant:

int UdpBitDht::recvPkt(void *data, int size, struct sockaddr_in &from) {
	/* pass onto bitdht */
	bdStackMutex stack(dhtMtx); /********** MUTEX LOCKED *************/

	/* check packet suitability */
	if (mBitDhtManager->isBitDhtPacket((char *) data, size, from)) {

		mReadBytes += size;
		mBitDhtManager->incomingMsg(&from, (char *) data, size);
		return 1;
	}
	return 0;
}